

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ScaleProgram::draw
          (ScaleProgram *this,GLuint vao,GLfloat scale,bool tf,Surface *dst)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  deBool dVar4;
  undefined4 extraout_var;
  Rectangle RVar6;
  undefined1 local_50 [8];
  Rectangle viewport;
  Random rnd;
  Functions *gl;
  Surface *dst_local;
  bool tf_local;
  GLfloat scale_local;
  GLuint vao_local;
  ScaleProgram *this_local;
  long lVar5;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  de::Random::Random((Random *)&viewport.width,vao);
  RVar6 = deqp::gls::LifetimeTests::details::randomViewport
                    (this->m_renderCtx,0x80,0x80,(Random *)&viewport.width);
  viewport._0_8_ = RVar6._8_8_;
  local_50 = RVar6._0_8_;
  deqp::gls::LifetimeTests::details::setViewport(this->m_renderCtx,(Rectangle *)local_50);
  (**(code **)(lVar5 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar5 + 0x188))(0x4100);
  (**(code **)(lVar5 + 0xd8))(vao);
  (**(code **)(lVar5 + 0x610))(this->m_posLoc);
  do {
    pcVar1 = *(code **)(lVar5 + 0x1680);
    dVar3 = glu::ShaderProgram::getProgram(&this->super_ShaderProgram);
    (*pcVar1)(dVar3);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"gl.useProgram(getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x8b);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  (**(code **)(lVar5 + 0x14e0))(scale,this->m_scaleLoc);
  if (tf) {
    (**(code **)(lVar5 + 0x30))(4);
  }
  do {
    (**(code **)(lVar5 + 0x538))(4,0,3);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"gl.drawArrays(GL_TRIANGLES, 0, 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x91);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  if (tf) {
    (**(code **)(lVar5 + 0x638))();
  }
  if (dst != (Surface *)0x0) {
    deqp::gls::LifetimeTests::details::readRectangle(this->m_renderCtx,(Rectangle *)local_50,dst);
  }
  (**(code **)(lVar5 + 0xd8))(0);
  de::Random::~Random((Random *)&viewport.width);
  return;
}

Assistant:

void ScaleProgram::draw (GLuint vao, GLfloat scale, bool tf, Surface* dst)
{
	const Functions&	gl			= m_renderCtx.getFunctions();
	de::Random			rnd			(vao);
	Rectangle			viewport	= randomViewport(m_renderCtx,
													 VIEWPORT_SIZE, VIEWPORT_SIZE, rnd);
	setViewport(m_renderCtx, viewport);
	gl.clearColor(0, 0, 0, 1);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	gl.bindVertexArray(vao);
	gl.enableVertexAttribArray(m_posLoc);
	GLU_CHECK_CALL_ERROR(gl.useProgram(getProgram()),
						 gl.getError());

	gl.uniform1f(m_scaleLoc, scale);

	if (tf)
		gl.beginTransformFeedback(GL_TRIANGLES);
	GLU_CHECK_CALL_ERROR(gl.drawArrays(GL_TRIANGLES, 0, 3), gl.getError());
	if (tf)
		gl.endTransformFeedback();

	if (dst != DE_NULL)
		readRectangle(m_renderCtx, viewport, *dst);

	gl.bindVertexArray(0);
}